

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mp_wrapper.hpp
# Opt level: O0

double convert<double>(char *str)

{
  string *in_RDI;
  double dVar1;
  size_t *in_stack_ffffffffffffffa8;
  allocator local_29;
  string local_28 [40];
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_28,(char *)in_RDI,&local_29);
  dVar1 = std::__cxx11::stod(in_RDI,in_stack_ffffffffffffffa8);
  std::__cxx11::string::~string(local_28);
  std::allocator<char>::~allocator((allocator<char> *)&local_29);
  return dVar1;
}

Assistant:

inline double convert<double>(const char* str) { return std::stod(str); }